

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O1

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateFragStencilRefAtDefinition
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst)

{
  bool bVar1;
  spv_result_t sVar2;
  long *plVar3;
  Instruction *inst_00;
  long *plVar4;
  uint32_t underlying_type;
  BuiltIn builtin;
  uint32_t local_9c;
  undefined8 *local_98;
  undefined8 uStack_90;
  code *local_88;
  code *pcStack_80;
  uint local_74;
  long *local_70;
  long local_68;
  long local_60;
  uint32_t uStack_58;
  undefined4 uStack_54;
  string local_50;
  
  bVar1 = spvIsVulkanEnv(this->_->context_->target_env);
  if (bVar1) {
    if (decoration->dec_type_ != BuiltIn) {
      __assert_fail("dec_type_ == spv::Decoration::BuiltIn",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/decoration.h"
                    ,0x4f,"spv::BuiltIn spvtools::val::Decoration::builtin() const");
    }
    local_74 = *(decoration->params_).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_88 = (code *)0x0;
    pcStack_80 = (code *)0x0;
    local_98 = (undefined8 *)0x0;
    uStack_90 = 0;
    local_98 = (undefined8 *)operator_new(0x18);
    *local_98 = this;
    local_98[1] = inst;
    local_98[2] = &local_74;
    pcStack_80 = std::
                 _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_builtins.cpp:3770:13)>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_builtins.cpp:3770:13)>
               ::_M_manager;
    inst_00 = (Instruction *)&local_9c;
    local_9c = 0;
    sVar2 = GetUnderlyingType(this->_,decoration,inst,(uint32_t *)inst_00);
    if (sVar2 == SPV_SUCCESS) {
      bVar1 = ValidationState_t::IsIntScalarType(this->_,local_9c);
      sVar2 = SPV_SUCCESS;
      if (!bVar1) {
        (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                  (&local_50,decoration,(Decoration *)inst,inst_00);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
        plVar4 = plVar3 + 2;
        if ((long *)*plVar3 == plVar4) {
          local_60 = *plVar4;
          uStack_58 = *(uint32_t *)(plVar3 + 3);
          uStack_54 = *(undefined4 *)((long)plVar3 + 0x1c);
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar4;
          local_70 = (long *)*plVar3;
        }
        local_68 = plVar3[1];
        *plVar3 = (long)plVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if (local_88 == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        sVar2 = (*pcStack_80)(&local_98,&local_70);
        if (local_70 != &local_60) {
          operator_delete(local_70,local_60 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if (local_88 != (code *)0x0) {
      (*local_88)(&local_98,&local_98,3);
    }
    if (sVar2 != SPV_SUCCESS) {
      return sVar2;
    }
  }
  sVar2 = ValidateFragStencilRefAtReference(this,decoration,inst,inst,inst);
  return sVar2;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateFragStencilRefAtDefinition(const Decoration& decoration,
                                            const Instruction& inst) {
  if (spvIsVulkanEnv(_.context()->target_env)) {
    const spv::BuiltIn builtin = decoration.builtin();
    if (spv_result_t error = ValidateI(
            decoration, inst,
            [this, &inst, &builtin](const std::string& message) -> spv_result_t {
              uint32_t vuid = GetVUIDForBuiltin(builtin, VUIDErrorType);
              return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                     << _.VkErrorID(vuid) << "According to the "
                     << spvLogStringForEnv(_.context()->target_env)
                     << " spec BuiltIn "
                     << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN,
                                                      uint32_t(builtin))
                     << " variable needs to be a int scalar. "
                     << message;
            })) {
      return error;
    }
  }

  return ValidateFragStencilRefAtReference(decoration, inst, inst, inst);
}